

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O2

int __thiscall
cmCPackIFWPackage::ConfigureFromComponent(cmCPackIFWPackage *this,cmCPackComponent *component)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmCPackIFWGenerator *pcVar1;
  cmCPackLog *pcVar2;
  bool bVar3;
  int iVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  pointer ppcVar7;
  mapped_type *__v;
  ostream *poVar8;
  iterator dit;
  pointer __k;
  string local_1e8;
  string prefix;
  ostringstream cmCPackLog_msg;
  
  if (component == (cmCPackComponent *)0x0) {
    iVar4 = 0;
  }
  else {
    DefaultConfiguration(this);
    cmsys::SystemTools::UpperCase(&local_1e8,&component->Name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,"CPACK_IFW_COMPONENT_",&local_1e8);
    std::operator+(&prefix,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &cmCPackLog_msg,"_");
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::string((string *)&cmCPackLog_msg,"",(allocator *)&local_1e8);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->DisplayName,(key_type *)&cmCPackLog_msg);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string((string *)&cmCPackLog_msg,"",(allocator *)&local_1e8);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->Description,(key_type *)&cmCPackLog_msg);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&prefix,"VERSION");
    pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar6 == (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_VERSION",(allocator *)&local_1e8);
      cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      std::__cxx11::string::assign((char *)&this->Version);
    }
    else {
      std::__cxx11::string::assign((char *)&this->Version);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&prefix,"SCRIPT");
    pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar6 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->Script);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&prefix,"USER_INTERFACES");
    pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar6 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->UserInterfaces);
      std::__cxx11::string::string((string *)&cmCPackLog_msg,pcVar6,(allocator *)&local_1e8);
      cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,&this->UserInterfaces,false);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    __k = (component->Dependencies).
          super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
          super__Vector_impl_data._M_start;
    ppcVar7 = (component->Dependencies).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (__k != ppcVar7) {
      for (; __k != ppcVar7; __k = __k + 1) {
        __v = std::
              map<cmCPackComponent_*,_cmCPackIFWPackage_*,_std::less<cmCPackComponent_*>,_std::allocator<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>_>
              ::operator[](&((this->super_cmCPackIFWCommon).Generator)->ComponentPackages,__k);
        std::
        _Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
        ::_M_insert_unique<cmCPackIFWPackage*const&>
                  ((_Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
                    *)&this->Dependencies,__v);
        ppcVar7 = (component->Dependencies).
                  super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&prefix,"LICENSES");
    pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar6 != (char *)0x0) {
      this_00 = &this->Licenses;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(this_00);
      std::__cxx11::string::string((string *)&cmCPackLog_msg,pcVar6,(allocator *)&local_1e8);
      cmSystemTools::ExpandListArgument((string *)&cmCPackLog_msg,this_00,false);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if ((*(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
           *(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start & 0x20U) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar8 = std::operator<<((ostream *)&cmCPackLog_msg,(string *)&prefix);
        poVar8 = std::operator<<(poVar8,"LICENSES");
        poVar8 = std::operator<<(poVar8," should contain pairs of <display_name> and <file_path>.");
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar1 = (this->super_cmCPackIFWCommon).Generator;
        if (pcVar1 != (cmCPackIFWGenerator *)0x0) {
          pcVar2 = (pcVar1->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar2,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                          ,0xde,local_1e8._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_1e8);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(this_00);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&prefix,"PRIORITY");
    pcVar6 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar6 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&this->SortingPriority);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar8 = std::operator<<((ostream *)&cmCPackLog_msg,"The \"PRIORITY\" option is set ");
      poVar8 = std::operator<<(poVar8,"for component \"");
      poVar8 = std::operator<<(poVar8,(string *)component);
      poVar8 = std::operator<<(poVar8,"\", but there option is ");
      poVar8 = std::operator<<(poVar8,"deprecated. Please use \"SORTING_PRIORITY\" option instead.")
      ;
      std::endl<char,std::char_traits<char>>(poVar8);
      pcVar1 = (this->super_cmCPackIFWCommon).Generator;
      if (pcVar1 != (cmCPackIFWGenerator *)0x0) {
        pcVar2 = (pcVar1->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar2,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                        ,0xea,local_1e8._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    }
    std::__cxx11::string::assign((char *)&this->Default);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&prefix,"ESSENTIAL");
    bVar3 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar3) {
      std::__cxx11::string::assign((char *)&this->Essential);
    }
    std::__cxx11::string::assign((char *)&this->Virtual);
    std::__cxx11::string::assign((char *)&this->ForcedInstallation);
    ConfigureFromPrefix(this,&prefix);
    std::__cxx11::string::~string((string *)&prefix);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromComponent(cmCPackComponent* component)
{
  if (!component) {
    return 0;
  }

  // Restore defaul configuration
  this->DefaultConfiguration();

  std::string prefix = "CPACK_IFW_COMPONENT_" +
    cmsys::SystemTools::UpperCase(component->Name) + "_";

  // Display name
  this->DisplayName[""] = component->DisplayName;

  // Description
  this->Description[""] = component->Description;

  // Version
  if (const char* optVERSION = this->GetOption(prefix + "VERSION")) {
    this->Version = optVERSION;
  } else if (const char* optPACKAGE_VERSION =
               this->GetOption("CPACK_PACKAGE_VERSION")) {
    this->Version = optPACKAGE_VERSION;
  } else {
    this->Version = "1.0.0";
  }

  // Script
  if (const char* option = this->GetOption(prefix + "SCRIPT")) {
    this->Script = option;
  }

  // User interfaces
  if (const char* option = this->GetOption(prefix + "USER_INTERFACES")) {
    this->UserInterfaces.clear();
    cmSystemTools::ExpandListArgument(option, this->UserInterfaces);
  }

  // CMake dependencies
  if (!component->Dependencies.empty()) {
    std::vector<cmCPackComponent*>::iterator dit;
    for (dit = component->Dependencies.begin();
         dit != component->Dependencies.end(); ++dit) {
      this->Dependencies.insert(this->Generator->ComponentPackages[*dit]);
    }
  }

  // Licenses
  if (const char* option = this->GetOption(prefix + "LICENSES")) {
    this->Licenses.clear();
    cmSystemTools::ExpandListArgument(option, this->Licenses);
    if (this->Licenses.size() % 2 != 0) {
      cmCPackIFWLogger(
        WARNING,
        prefix << "LICENSES"
               << " should contain pairs of <display_name> and <file_path>."
               << std::endl);
      this->Licenses.clear();
    }
  }

  // Priority
  if (const char* option = this->GetOption(prefix + "PRIORITY")) {
    this->SortingPriority = option;
    cmCPackIFWLogger(
      WARNING, "The \"PRIORITY\" option is set "
        << "for component \"" << component->Name << "\", but there option is "
        << "deprecated. Please use \"SORTING_PRIORITY\" option instead."
        << std::endl);
  }

  // Default
  this->Default = component->IsDisabledByDefault ? "false" : "true";

  // Essential
  if (this->IsOn(prefix + "ESSENTIAL")) {
    this->Essential = "true";
  }

  // Virtual
  this->Virtual = component->IsHidden ? "true" : "";

  // ForcedInstallation
  this->ForcedInstallation = component->IsRequired ? "true" : "false";

  return this->ConfigureFromPrefix(prefix);
}